

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O1

void __thiscall Assimp::XFileExporter::WriteFile(XFileExporter *this)

{
  ostream *poVar1;
  aiMatrix4x4 I;
  aiMatrix4x4 local_60;
  
  *(uint *)(&this->field_0x20 + *(long *)(*(long *)&this->mOutput + -0x18)) =
       *(uint *)(&this->field_0x20 + *(long *)(*(long *)&this->mOutput + -0x18)) | 4;
  *(undefined8 *)(&this->field_0x10 + *(long *)(*(long *)&this->mOutput + -0x18)) = 8;
  WriteHeader(this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x18,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Frame DXCC_ROOT {",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  local_60.a1 = 1.0;
  local_60.a2 = 0.0;
  local_60.a3 = 0.0;
  local_60.a4 = 0.0;
  local_60.b1 = 0.0;
  local_60.b2 = 1.0;
  local_60.b3 = 0.0;
  local_60.b4 = 0.0;
  local_60.c1 = 0.0;
  local_60.c2 = 0.0;
  local_60.c3 = 1.0;
  local_60.c4 = 0.0;
  local_60.d1 = 0.0;
  local_60.d2 = 0.0;
  local_60.d3 = 0.0;
  local_60.d4 = 1.0;
  WriteFrameTransform(this,&local_60);
  WriteNode(this,this->mScene->mRootNode);
  PopTag(this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x18,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  return;
}

Assistant:

void XFileExporter::WriteFile()
{
    // note, that all realnumber values must be comma separated in x files
    mOutput.setf(std::ios::fixed);
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION); // precision for ai_real

    // entry of writing the file
    WriteHeader();

    mOutput << startstr << "Frame DXCC_ROOT {" << endstr;
    PushTag();

    aiMatrix4x4 I; // identity
    WriteFrameTransform(I);

    WriteNode(mScene->mRootNode);
    PopTag();

    mOutput << startstr << "}" << endstr;

}